

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radefs_p.h
# Opt level: O1

Error __thiscall
asmjit::RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_>::nonOverlappingUnionOf
          (RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *this,ZoneAllocator *allocator,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *x,
          RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>_> *y,DataType *yData)

{
  String *pSVar1;
  uint *puVar2;
  String *pSVar3;
  bool bVar4;
  Error EVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  char c;
  ulong uVar9;
  ulong uVar10;
  uint *puVar11;
  String *this_00;
  uint *puVar12;
  
  uVar6 = (y->_data).super_ZoneVectorBase._size + (x->_data).super_ZoneVectorBase._size;
  EVar5 = 0;
  if ((this->_data).super_ZoneVectorBase._capacity < uVar6) {
    EVar5 = ZoneVectorBase::_reserve((ZoneVectorBase *)this,allocator,0xc,uVar6);
  }
  if (EVar5 != 0) {
    return EVar5;
  }
  pSVar3 = (String *)(this->_data).super_ZoneVectorBase._data;
  puVar12 = (uint *)(x->_data).super_ZoneVectorBase._data;
  puVar8 = (uint *)(y->_data).super_ZoneVectorBase._data;
  uVar9 = (ulong)(x->_data).super_ZoneVectorBase._size;
  puVar2 = puVar12 + uVar9 * 3;
  uVar10 = (ulong)(y->_data).super_ZoneVectorBase._size;
  puVar11 = puVar8 + uVar10 * 3;
  this_00 = pSVar3;
  if (uVar10 != 0 && uVar9 != 0) {
    uVar6 = *puVar12;
    do {
      while (uVar7 = puVar8[1], EVar5 = 0, uVar7 <= uVar6) {
        *(uint *)&this_00->field_0 = *puVar8;
        *(uint *)((long)&this_00->field_0 + 4) = uVar7;
        *(uint32_t *)((long)&this_00->field_0 + 8) = yData->id;
        this_00 = (String *)((long)&this_00->field_0 + 0xc);
        puVar8 = puVar8 + 3;
        if (puVar8 == puVar11) {
          bVar4 = true;
          goto LAB_001239f3;
        }
      }
      uVar6 = *puVar8;
      while (uVar7 = puVar12[1], uVar7 <= uVar6) {
        pSVar1 = (String *)((long)&this_00->field_0 + 0xc);
        *(uint *)&this_00->field_0 = *puVar12;
        *(uint *)((long)&this_00->field_0 + 4) = uVar7;
        *(uint *)((long)&this_00->field_0 + 8) = puVar12[2];
        puVar12 = puVar12 + 3;
        this_00 = pSVar1;
        if (puVar12 == puVar2) {
          bVar4 = true;
          goto LAB_001239f3;
        }
      }
      uVar6 = *puVar12;
    } while (puVar8[1] <= uVar6);
    EVar5 = 0xffffffff;
    bVar4 = false;
LAB_001239f3:
    if (!bVar4) {
      return EVar5;
    }
  }
  for (; puVar12 != puVar2; puVar12 = puVar12 + 3) {
    *(undefined8 *)&this_00->field_0 = *(undefined8 *)puVar12;
    *(uint *)((long)&this_00->field_0 + 8) = puVar12[2];
    this_00 = (String *)((long)&this_00->field_0 + 0xc);
  }
  for (; puVar8 != puVar11; puVar8 = puVar8 + 3) {
    *(undefined8 *)&this_00->field_0 = *(undefined8 *)puVar8;
    *(uint32_t *)((long)&this_00->field_0 + 8) = yData->id;
    this_00 = (String *)((long)&this_00->field_0 + 0xc);
  }
  if ((this_00 < pSVar3) ||
     (uVar6 = (this->_data).super_ZoneVectorBase._capacity,
     (String *)((long)&pSVar3->field_0 + (ulong)uVar6 * 0xc) < this_00)) {
    RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  }
  else {
    this_00 = (String *)((ulong)((long)this_00 - (long)pSVar3) >> 2);
    uVar7 = (int)this_00 * -0x55555555;
    if (uVar7 <= uVar6) {
      (this->_data).super_ZoneVectorBase._size = uVar7;
      return 0;
    }
  }
  c = (char)puVar11;
  RALiveSpans<asmjit::RALiveSpan<asmjit::LiveRegData>>::nonOverlappingUnionOf();
  EVar5 = String::_opChar(this_00,1,c);
  return EVar5;
}

Assistant:

ASMJIT_INLINE Error nonOverlappingUnionOf(ZoneAllocator* allocator, const RALiveSpans<T>& x, const RALiveSpans<T>& y, const DataType& yData) noexcept {
    uint32_t finalSize = x.size() + y.size();
    ASMJIT_PROPAGATE(_data.reserve(allocator, finalSize));

    T* dstPtr = _data.data();
    const T* xSpan = x.data();
    const T* ySpan = y.data();

    const T* xEnd = xSpan + x.size();
    const T* yEnd = ySpan + y.size();

    // Loop until we have intersection or either `xSpan == xEnd` or `ySpan == yEnd`,
    // which means that there is no intersection. We advance either `xSpan` or `ySpan`
    // depending on their ranges.
    if (xSpan != xEnd && ySpan != yEnd) {
      uint32_t xa, ya;
      xa = xSpan->a;
      for (;;) {
        while (ySpan->b <= xa) {
          dstPtr->init(*ySpan, yData);
          dstPtr++;
          if (++ySpan == yEnd)
            goto Done;
        }

        ya = ySpan->a;
        while (xSpan->b <= ya) {
          *dstPtr++ = *xSpan;
          if (++xSpan == xEnd)
            goto Done;
        }

        // We know that `xSpan->b > ySpan->a`, so check if `ySpan->b > xSpan->a`.
        xa = xSpan->a;
        if (ySpan->b > xa)
          return 0xFFFFFFFFu;
      }
    }

  Done:
    while (xSpan != xEnd) {
      *dstPtr++ = *xSpan++;
    }

    while (ySpan != yEnd) {
      dstPtr->init(*ySpan, yData);
      dstPtr++;
      ySpan++;
    }

    _data._setEndPtr(dstPtr);
    return kErrorOk;
  }